

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O0

void Sim_UtilSimulateNode(Sim_Man_t *p,Abc_Obj_t *pNode,int fType,int fType1,int fType2)

{
  void **ppvVar1;
  int iVar2;
  int iVar3;
  int fComp2;
  int fComp1;
  int k;
  uint *pSimmNode2;
  uint *pSimmNode1;
  uint *pSimmNode;
  int fType2_local;
  int fType1_local;
  int fType_local;
  Abc_Obj_t *pNode_local;
  Sim_Man_t *p_local;
  
  iVar2 = Abc_ObjIsNode(pNode);
  if (iVar2 == 0) {
    iVar2 = Abc_ObjFaninNum(pNode);
    if (iVar2 != 1) {
      __assert_fail("Abc_ObjFaninNum(pNode) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simUtils.c"
                    ,0x10e,"void Sim_UtilSimulateNode(Sim_Man_t *, Abc_Obj_t *, int, int, int)");
    }
    if (fType == 0) {
      pSimmNode1 = (uint *)p->vSim0->pArray[pNode->Id];
    }
    else {
      pSimmNode1 = (uint *)p->vSim1->pArray[pNode->Id];
    }
    if (fType1 == 0) {
      ppvVar1 = p->vSim0->pArray;
      iVar2 = Abc_ObjFaninId0(pNode);
      pSimmNode2 = (uint *)ppvVar1[iVar2];
    }
    else {
      ppvVar1 = p->vSim1->pArray;
      iVar2 = Abc_ObjFaninId0(pNode);
      pSimmNode2 = (uint *)ppvVar1[iVar2];
    }
    iVar2 = Abc_ObjFaninC0(pNode);
    if (iVar2 == 0) {
      for (fComp2 = 0; fComp2 < p->nSimWords; fComp2 = fComp2 + 1) {
        pSimmNode1[fComp2] = pSimmNode2[fComp2];
      }
    }
    else {
      for (fComp2 = 0; fComp2 < p->nSimWords; fComp2 = fComp2 + 1) {
        pSimmNode1[fComp2] = pSimmNode2[fComp2] ^ 0xffffffff;
      }
    }
  }
  else {
    if (fType == 0) {
      pSimmNode1 = (uint *)p->vSim0->pArray[pNode->Id];
    }
    else {
      pSimmNode1 = (uint *)p->vSim1->pArray[pNode->Id];
    }
    if (fType1 == 0) {
      ppvVar1 = p->vSim0->pArray;
      iVar2 = Abc_ObjFaninId0(pNode);
      pSimmNode2 = (uint *)ppvVar1[iVar2];
    }
    else {
      ppvVar1 = p->vSim1->pArray;
      iVar2 = Abc_ObjFaninId0(pNode);
      pSimmNode2 = (uint *)ppvVar1[iVar2];
    }
    if (fType2 == 0) {
      ppvVar1 = p->vSim0->pArray;
      iVar2 = Abc_ObjFaninId1(pNode);
      _fComp1 = ppvVar1[iVar2];
    }
    else {
      ppvVar1 = p->vSim1->pArray;
      iVar2 = Abc_ObjFaninId1(pNode);
      _fComp1 = ppvVar1[iVar2];
    }
    iVar2 = Abc_ObjFaninC0(pNode);
    iVar3 = Abc_ObjFaninC1(pNode);
    if ((iVar2 == 0) || (iVar3 == 0)) {
      if ((iVar2 == 0) || (iVar3 != 0)) {
        if ((iVar2 == 0) && (iVar3 != 0)) {
          for (fComp2 = 0; fComp2 < p->nSimWords; fComp2 = fComp2 + 1) {
            pSimmNode1[fComp2] =
                 pSimmNode2[fComp2] & (*(uint *)((long)_fComp1 + (long)fComp2 * 4) ^ 0xffffffff);
          }
        }
        else {
          for (fComp2 = 0; fComp2 < p->nSimWords; fComp2 = fComp2 + 1) {
            pSimmNode1[fComp2] = pSimmNode2[fComp2] & *(uint *)((long)_fComp1 + (long)fComp2 * 4);
          }
        }
      }
      else {
        for (fComp2 = 0; fComp2 < p->nSimWords; fComp2 = fComp2 + 1) {
          pSimmNode1[fComp2] =
               (pSimmNode2[fComp2] ^ 0xffffffff) & *(uint *)((long)_fComp1 + (long)fComp2 * 4);
        }
      }
    }
    else {
      for (fComp2 = 0; fComp2 < p->nSimWords; fComp2 = fComp2 + 1) {
        pSimmNode1[fComp2] =
             (pSimmNode2[fComp2] ^ 0xffffffff) &
             (*(uint *)((long)_fComp1 + (long)fComp2 * 4) ^ 0xffffffff);
      }
    }
  }
  return;
}

Assistant:

void Sim_UtilSimulateNode( Sim_Man_t * p, Abc_Obj_t * pNode, int fType, int fType1, int fType2 )
{
    unsigned * pSimmNode, * pSimmNode1, * pSimmNode2;
    int k, fComp1, fComp2;
    // simulate the internal nodes
    if ( Abc_ObjIsNode(pNode) )
    {
        if ( fType )
            pSimmNode  = (unsigned *)p->vSim1->pArray[ pNode->Id ];
        else
            pSimmNode  = (unsigned *)p->vSim0->pArray[ pNode->Id ];

        if ( fType1 )
            pSimmNode1 = (unsigned *)p->vSim1->pArray[ Abc_ObjFaninId0(pNode) ];
        else
            pSimmNode1 = (unsigned *)p->vSim0->pArray[ Abc_ObjFaninId0(pNode) ];

        if ( fType2 )
            pSimmNode2 = (unsigned *)p->vSim1->pArray[ Abc_ObjFaninId1(pNode) ];
        else
            pSimmNode2 = (unsigned *)p->vSim0->pArray[ Abc_ObjFaninId1(pNode) ];

        fComp1 = Abc_ObjFaninC0(pNode);
        fComp2 = Abc_ObjFaninC1(pNode);
        if ( fComp1 && fComp2 )
            for ( k = 0; k < p->nSimWords; k++ )
                pSimmNode[k] = ~pSimmNode1[k] & ~pSimmNode2[k];
        else if ( fComp1 && !fComp2 )
            for ( k = 0; k < p->nSimWords; k++ )
                pSimmNode[k] = ~pSimmNode1[k] &  pSimmNode2[k];
        else if ( !fComp1 && fComp2 )
            for ( k = 0; k < p->nSimWords; k++ )
                pSimmNode[k] =  pSimmNode1[k] & ~pSimmNode2[k];
        else // if ( fComp1 && fComp2 )
            for ( k = 0; k < p->nSimWords; k++ )
                pSimmNode[k] =  pSimmNode1[k] &  pSimmNode2[k];
    }
    else 
    {
        assert( Abc_ObjFaninNum(pNode) == 1 );
        if ( fType )
            pSimmNode  = (unsigned *)p->vSim1->pArray[ pNode->Id ];
        else
            pSimmNode  = (unsigned *)p->vSim0->pArray[ pNode->Id ];

        if ( fType1 )
            pSimmNode1 = (unsigned *)p->vSim1->pArray[ Abc_ObjFaninId0(pNode) ];
        else
            pSimmNode1 = (unsigned *)p->vSim0->pArray[ Abc_ObjFaninId0(pNode) ];

        fComp1 = Abc_ObjFaninC0(pNode);
        if ( fComp1 )
            for ( k = 0; k < p->nSimWords; k++ )
                pSimmNode[k] = ~pSimmNode1[k];
        else 
            for ( k = 0; k < p->nSimWords; k++ )
                pSimmNode[k] =  pSimmNode1[k];
    }
}